

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::addClause_(SimpSolver *this,vec<Minisat::Lit,_int> *ps)

{
  int iVar1;
  int iVar2;
  Ref r;
  bool bVar3;
  uint *puVar4;
  vec<unsigned_int,_int> *this_00;
  int *piVar5;
  char *pcVar6;
  int i_1;
  ulong uVar7;
  int i;
  long lVar8;
  CRef cr;
  Ref local_3c;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *local_38;
  
  lVar8 = 0;
  while (lVar8 < ps->sz) {
    bVar3 = isEliminated(this,ps->data[lVar8].x >> 1);
    lVar8 = lVar8 + 1;
    if (bVar3) {
      __assert_fail("!isEliminated(var(ps[i]))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/simp/SimpSolver.cc"
                    ,0x98,"bool Minisat::SimpSolver::addClause_(vec<Lit> &)");
    }
  }
  iVar1 = (this->super_Solver).clauses.sz;
  if ((this->use_rcheck != false) && (bVar3 = implied(this,ps), bVar3)) {
    return true;
  }
  bVar3 = Solver::addClause_(&this->super_Solver,ps);
  if (bVar3) {
    bVar3 = true;
    if ((this->use_simplification == true) &&
       (iVar2 = (this->super_Solver).clauses.sz, iVar2 == iVar1 + 1)) {
      r = (this->super_Solver).clauses.data[(long)iVar2 + -1];
      local_3c = r;
      puVar4 = RegionAllocator<unsigned_int>::operator[](&(this->super_Solver).ca.ra,r);
      Queue<unsigned_int>::insert(&this->subsumption_queue,r);
      local_38 = &this->occurs;
      for (uVar7 = 0; uVar7 < *puVar4 >> 5; uVar7 = uVar7 + 1) {
        this_00 = IntMap<int,_Minisat::vec<unsigned_int,_int>,_Minisat::MkIndexDefault<int>_>::
                  operator[](&local_38->occs,(int)puVar4[uVar7 + 1] >> 1);
        vec<unsigned_int,_int>::push(this_00,&local_3c);
        piVar5 = IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>::operator[]
                           (&(this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>,
                            (Lit)puVar4[uVar7 + 1]);
        *piVar5 = *piVar5 + 1;
        pcVar6 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                           (&(this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                            (int)puVar4[uVar7 + 1] >> 1);
        *pcVar6 = '\x01';
        this->n_touched = this->n_touched + 1;
        bVar3 = Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::inHeap
                          (&this->elim_heap,(int)puVar4[uVar7 + 1] >> 1);
        if (bVar3) {
          Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::increase
                    (&this->elim_heap,(int)puVar4[uVar7 + 1] >> 1);
        }
      }
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool SimpSolver::addClause_(vec<Lit>& ps)
{
#ifndef NDEBUG
    for (int i = 0; i < ps.size(); i++)
        assert(!isEliminated(var(ps[i])));
#endif

    int nclauses = clauses.size();

    if (use_rcheck && implied(ps))
        return true;

    if (!Solver::addClause_(ps))
        return false;

    if (use_simplification && clauses.size() == nclauses + 1){
        CRef          cr = clauses.last();
        const Clause& c  = ca[cr];

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++){
            occurs[var(c[i])].push(cr);
            n_occ[c[i]]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i])))
                elim_heap.increase(var(c[i]));
        }
    }

    return true;
}